

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall
CRegexParser::build_alter
          (CRegexParser *this,re_machine *new_machine,re_machine *lhs,re_machine *rhs)

{
  re_tuple_conflict *prVar1;
  re_state_id rVar2;
  
  rVar2 = alloc_state(this);
  new_machine->init = rVar2;
  rVar2 = alloc_state(this);
  new_machine->final = rVar2;
  if ((long)new_machine->init != -1) {
    rVar2 = lhs->init;
    prVar1 = this->tuple_arr_ + new_machine->init;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
    if ((long)new_machine->init != -1) {
      rVar2 = rhs->init;
      prVar1 = this->tuple_arr_ + new_machine->init;
      if (prVar1->next_state_1 == -1) {
        prVar1->typ = RE_EPSILON;
        (prVar1->info).ch = L'\0';
        prVar1->next_state_1 = rVar2;
      }
      else {
        prVar1->next_state_2 = rVar2;
      }
    }
  }
  if ((long)lhs->final != -1) {
    rVar2 = new_machine->final;
    prVar1 = this->tuple_arr_ + lhs->final;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  if ((long)rhs->final != -1) {
    rVar2 = new_machine->final;
    prVar1 = this->tuple_arr_ + rhs->final;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  return;
}

Assistant:

void CRegexParser::build_alter(re_machine *new_machine,
                               re_machine *lhs, re_machine *rhs)
{
    /* initialize the new machine */
    init_machine(new_machine);

    /*
     *   Set up an epsilon transition from our new machine's initial state
     *   to the initial state of each submachine 
     */
    set_trans(new_machine->init, lhs->init, RE_EPSILON, 0);
    set_trans(new_machine->init, rhs->init, RE_EPSILON, 0);

    /*
     *   Set up an epsilon transition from the final state of each
     *   submachine to our final state 
     */
    set_trans(lhs->final, new_machine->final, RE_EPSILON, 0);
    set_trans(rhs->final, new_machine->final, RE_EPSILON, 0);
}